

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

void __thiscall
upb_test::FuzzTest_RoundTripDescriptorRegressionOneofSameName_Test::
FuzzTest_RoundTripDescriptorRegressionOneofSameName_Test
          (FuzzTest_RoundTripDescriptorRegressionOneofSameName_Test *this)

{
  FuzzTest_RoundTripDescriptorRegressionOneofSameName_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__FuzzTest_RoundTripDescriptorRegressionOneofSameName_Test_00a15418;
  return;
}

Assistant:

TEST(FuzzTest, RoundTripDescriptorRegressionOneofSameName) {
  RoundTripDescriptor(ParseTextProtoOrDie(
      R"pb(file {
             name: "N"
             package: ""
             message_type {
               name: "b"
               field { name: "W" number: 1 type: TYPE_BYTES oneof_index: 0 }
               field { name: "W" number: 17 type: TYPE_UINT32 oneof_index: 0 }
               oneof_decl { name: "k" }
             }
           })pb"));
}